

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O0

void wiz_create_item_subdisplay
               (menu_conflict *m,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  wchar_t a_idx;
  void *pvVar1;
  char local_d8 [8];
  char name [70];
  char local_88 [4];
  wchar_t current_tval;
  char buf [70];
  wchar_t selected;
  int *choices;
  wchar_t width_local;
  wchar_t col_local;
  wchar_t row_local;
  _Bool cursor_local;
  wchar_t oid_local;
  menu_conflict *m_local;
  
  pvVar1 = menu_priv(m);
  a_idx = *(wchar_t *)((long)pvVar1 + (long)oid * 4);
  if (a_idx == L'\xffffd8f1') {
    unique0x00011f80 = *(wchar_t *)((long)pvVar1 + (long)(oid + L'\x01') * 4);
    object_base_name(local_d8,0x46,unique0x00011f80,true);
    if ((choose_artifact & 1U) == 0) {
      strnfmt(local_88,0x46,"All %s",local_d8);
    }
    else {
      strnfmt(local_88,0x46,"All artifact %s",local_d8);
    }
  }
  else if ((choose_artifact & 1U) == 0) {
    object_kind_name(local_88,0x46,k_info + a_idx,true);
  }
  else {
    get_art_name(local_88,L'F',a_idx);
  }
  c_prt(curs_attrs[1][(int)(uint)cursor],local_88,row,col);
  return;
}

Assistant:

static void wiz_create_item_subdisplay(struct menu *m, int oid, bool cursor,
	int row, int col, int width)
{
	int *choices = menu_priv(m);
	int selected = choices[oid];
	char buf[70];

	if (selected == WIZ_CREATE_ALL_MENU_ITEM) {
		/*
		 * Super big hack: the special flag should be the last menu
		 * item, with the selected tval stored in the next element.
		 */
		int current_tval = choices[oid + 1];
		char name[70];

		object_base_name(name, sizeof(name), current_tval, true);
		if (choose_artifact) {
			strnfmt(buf, sizeof(buf), "All artifact %s", name);
		} else {
			strnfmt(buf, sizeof(buf), "All %s", name);
		}
	} else {
		if (choose_artifact) {
			get_art_name(buf, sizeof(buf), selected);
		} else {
			object_kind_name(buf, sizeof(buf), &k_info[selected],
				true);
		}
	}

	c_prt(curs_attrs[CURS_KNOWN][0 != cursor], buf, row, col);
}